

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

ctmbstr tidyOptGetNextPriorityAttr(TidyDoc tdoc,TidyIterator *iter)

{
  ctmbstr ptVar1;
  TidyIterator p_Var2;
  TidyDocImpl *impl;
  TidyIterator p_Var3;
  
  if (tdoc == (TidyDoc)0x0) {
    if (iter != (TidyIterator *)0x0) {
      *iter = (TidyIterator)0x0;
    }
    return (ctmbstr)0x0;
  }
  if (iter == (TidyIterator *)0x0) {
    __assert_fail("iter != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/attrs.c"
                  ,0x3ea,"ctmbstr prvTidygetNextPriorityAttr(TidyDocImpl *, TidyIterator *)");
  }
  p_Var2 = *iter;
  if (p_Var2 == (TidyIterator)0x0) {
    p_Var2 = (TidyIterator)0x0;
  }
  else if (p_Var2 <= (TidyIterator)(ulong)(uint)tdoc[0xb2c]._opaque) {
    ptVar1 = *(ctmbstr *)(*(long *)(tdoc + 0xb2a) + -8 + (long)p_Var2 * 8);
    p_Var2 = (TidyIterator)((long)&p_Var2->_opaque + 1);
    goto LAB_0013784e;
  }
  ptVar1 = (ctmbstr)0x0;
LAB_0013784e:
  p_Var3 = (TidyIterator)0x0;
  if (p_Var2 <= (TidyIterator)(ulong)(uint)tdoc[0xb2c]._opaque) {
    p_Var3 = p_Var2;
  }
  *iter = p_Var3;
  return ptVar1;
}

Assistant:

ctmbstr TIDY_CALL      tidyOptGetNextPriorityAttr(TidyDoc tdoc, TidyIterator* iter )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    ctmbstr result = NULL;
    if ( impl )
        result = TY_(getNextPriorityAttr)( impl, iter );
    else if ( iter )
        *iter = 0;
    return result;
}